

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O0

int omac_acpkm_imit_update(EVP_MD_CTX *ctx,void *data,size_t count)

{
  char *file;
  undefined8 in_RDX;
  size_t in_RSI;
  void *in_RDI;
  OMAC_ACPKM_CTX *c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  file = (char *)EVP_MD_CTX_get0_md_data(in_RDI);
  if (*(int *)(file + 0x18) == 0) {
    ERR_GOST_error((int)((ulong)in_RDX >> 0x20),(int)in_RDX,file,0);
    iVar1 = 0;
  }
  else {
    iVar1 = CMAC_ACPKM_Update((CMAC_ACPKM_CTX *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                              in_RSI);
  }
  return iVar1;
}

Assistant:

static int omac_acpkm_imit_update(EVP_MD_CTX *ctx, const void *data,
                                  size_t count)
{
    OMAC_ACPKM_CTX *c = EVP_MD_CTX_md_data(ctx);
    if (!c->key_set) {
        GOSTerr(GOST_F_OMAC_ACPKM_IMIT_UPDATE, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }

    return CMAC_ACPKM_Update(c->cmac_ctx, data, count);
}